

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_OFFReader_::read_binary
          (_OFFReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt,bool param_4)

{
  byte *pbVar1;
  VertexHandle VVar2;
  undefined4 uVar3;
  _OFFReader_ *p_Var4;
  uint uVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  size_type *local_110;
  string header;
  float local_e8;
  uint dummy;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  VHandles vhandles;
  uint local_a4;
  uint local_a0;
  uint k;
  uint l;
  uint idx;
  uint nF;
  float local_88;
  float local_84;
  Vec4f cAf;
  Vec3f cf;
  uint j;
  float local_60;
  undefined1 local_5c [4];
  uint nV;
  Vec3i c;
  Vec4i cA;
  VertexHandle local_34;
  
  t.super_VectorDataT<float,_2>.values_ = (VectorDataT<float,_2>)(float  [2])0x0;
  vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110 = &header._M_string_length;
  header._M_dataplus._M_p = (pointer)0x0;
  header._M_string_length._0_1_ = 0;
  p_Var4 = (_OFFReader_ *)_in;
  _nF = _opt;
  cA.super_VectorDataT<int,_4>.values_._8_8_ = _bi;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&local_110);
  readValue(p_Var4,_in,(uint *)&local_60);
  readValue(p_Var4,_in,&l);
  readValue(p_Var4,_in,(uint *)(header.field_2._M_local_buf + 0xc));
  fVar6 = local_60;
  idx = l;
  p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
  (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0xd8))
            (cA.super_VectorDataT<int,_4>.values_._8_8_,local_60,(int)local_60 * 3);
  while ((bVar8 = fVar6 != 0.0, fVar6 = (float)((int)fVar6 + -1), bVar8 &&
         (((byte)_in[*(long *)(*(long *)_in + -0x18) + 0x20] & 2) == 0))) {
    readValue(p_Var4,_in,&local_e8);
    readValue(p_Var4,_in,(float *)&dummy);
    readValue(p_Var4,_in,(float *)&v);
    p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
    uVar3 = (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x10))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,&local_e8);
    if (((this->options_).flags_ & 0x10) != 0) {
      readValue(p_Var4,_in,v.super_VectorDataT<float,_3>.values_ + 1);
      readValue(p_Var4,_in,v.super_VectorDataT<float,_3>.values_ + 2);
      readValue(p_Var4,_in,(float *)&n);
      if (((this->userOptions_).flags_ & 0x10) != 0) {
        p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
        (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x40))
                  (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,
                   v.super_VectorDataT<float,_3>.values_ + 1);
      }
    }
    uVar5 = (this->options_).flags_;
    if ((uVar5 & 0x20) != 0) {
      if (((this->userOptions_).flags_ & 0x1000) == 0) {
        if ((uVar5 >> 0xb & 1) == 0) {
          readValue(p_Var4,_in,(int *)local_5c);
          readValue(p_Var4,_in,(int *)&nV);
          readValue(p_Var4,_in,(int *)&c);
          VVar2.super_BaseHandle.idx_ = local_34.super_BaseHandle.idx_;
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            local_34.super_BaseHandle.idx_._1_1_ = (undefined1)nV;
            local_34.super_BaseHandle.idx_._0_1_ = local_5c[0];
            local_34.super_BaseHandle.idx_._3_1_ = VVar2.super_BaseHandle.idx_._3_1_;
            local_34.super_BaseHandle.idx_._2_1_ =
                 (undefined1)c.super_VectorDataT<int,_3>.values_[0];
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x48))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,&local_34);
          }
        }
        else {
          readValue(p_Var4,_in,c.super_VectorDataT<int,_3>.values_ + 1);
          readValue(p_Var4,_in,c.super_VectorDataT<int,_3>.values_ + 2);
          readValue(p_Var4,_in,(int *)&cA);
          readValue(p_Var4,_in,cA.super_VectorDataT<int,_4>.values_ + 1);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            local_34.super_BaseHandle.idx_._1_1_ =
                 (undefined1)c.super_VectorDataT<int,_3>.values_[2];
            local_34.super_BaseHandle.idx_._0_1_ =
                 (undefined1)c.super_VectorDataT<int,_3>.values_[1];
            local_34.super_BaseHandle.idx_._2_1_ =
                 (undefined1)cA.super_VectorDataT<int,_4>.values_[0];
            local_34.super_BaseHandle.idx_._3_1_ =
                 (undefined1)cA.super_VectorDataT<int,_4>.values_[1];
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x50))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,&local_34);
          }
        }
      }
      else {
        pbVar1 = (byte *)((long)&_nF->flags_ + 1);
        *pbVar1 = *pbVar1 | 0x10;
        if (((this->options_).flags_ & 0x800) == 0) {
          readValue(p_Var4,_in,cAf.super_VectorDataT<float,_4>.field_0.m128 + 2);
          readValue(p_Var4,_in,cAf.super_VectorDataT<float,_4>.field_0.m128 + 3);
          readValue(p_Var4,_in,(float *)&cf);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x58))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,
                       (undefined1 *)((long)&cAf.super_VectorDataT<float,_4>.field_0 + 8));
          }
        }
        else {
          readValue(p_Var4,_in,&local_88);
          readValue(p_Var4,_in,&local_84);
          readValue(p_Var4,_in,(float *)&cAf);
          readValue(p_Var4,_in,cAf.super_VectorDataT<float,_4>.field_0.m128 + 1);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x60))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,&local_88);
          }
        }
      }
    }
    if (((this->options_).flags_ & 0x40) != 0) {
      readValue(p_Var4,_in,n.super_VectorDataT<float,_3>.values_ + 1);
      readValue(p_Var4,_in,n.super_VectorDataT<float,_3>.values_ + 2);
      if (((this->userOptions_).flags_ & 0x40) != 0) {
        p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
        (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x68))
                  (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,
                   n.super_VectorDataT<float,_3>.values_ + 1);
      }
    }
  }
  unique0x10000d8f = this;
  for (uVar5 = 0; uVar5 != idx; uVar5 = uVar5 + 1) {
    readValue(p_Var4,_in,(uint *)&local_60);
    fVar6 = local_60;
    if (local_60 == 4.2039e-45) {
      p_Var4 = (_OFFReader_ *)&t;
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)&t,3);
      readValue(p_Var4,_in,(uint *)(cf.super_VectorDataT<float,_3>.values_ + 1));
      readValue(p_Var4,_in,&local_a4);
      readValue(p_Var4,_in,&local_a0);
      *(float *)t.super_VectorDataT<float,_2>.values_ = cf.super_VectorDataT<float,_3>.values_[1];
      *(uint *)((long)t.super_VectorDataT<float,_2>.values_ + 4) = local_a4;
      *(uint *)((long)t.super_VectorDataT<float,_2>.values_ + 8) = local_a0;
    }
    else {
      fVar7 = local_60;
      if ((VectorDataT<float,_2>)
          vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start != t.super_VectorDataT<float,_2>.values_) {
        vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)t.super_VectorDataT<float,_2>.values_;
      }
      while (fVar7 != 0.0) {
        readValue(p_Var4,_in,&k);
        local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)k;
        p_Var4 = (_OFFReader_ *)&t;
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
        emplace_back<OpenMesh::VertexHandle>
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)&t,
                   &local_34);
        fVar7 = (float)((int)fVar7 + -1);
      }
      cf.super_VectorDataT<float,_3>.values_[1] = fVar6;
    }
    p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
    uVar3 = (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0x20))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,(_OFFReader_ *)&t);
    if (((uint)_nF->flags_ >> 9 & 1) != 0) {
      if (((stack0xffffffffffffff98->userOptions_).flags_ & 0x1000) == 0) {
        if (((stack0xffffffffffffff98->options_).flags_ & 0x800) == 0) {
          readValue(p_Var4,_in,(int *)local_5c);
          readValue(p_Var4,_in,(int *)&nV);
          readValue(p_Var4,_in,(int *)&c);
          VVar2.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_34;
          if (((stack0xffffffffffffff98->userOptions_).flags_ & 0x200) != 0) {
            local_34.super_BaseHandle.idx_._1_1_ = (undefined1)nV;
            local_34.super_BaseHandle.idx_._0_1_ = local_5c[0];
            local_34.super_BaseHandle.idx_._3_1_ = VVar2.super_BaseHandle.idx_._3_1_;
            local_34.super_BaseHandle.idx_._2_1_ =
                 (undefined1)c.super_VectorDataT<int,_3>.values_[0];
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0xa0))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,&local_34);
          }
        }
        else {
          readValue(p_Var4,_in,c.super_VectorDataT<int,_3>.values_ + 1);
          readValue(p_Var4,_in,c.super_VectorDataT<int,_3>.values_ + 2);
          readValue(p_Var4,_in,(int *)&cA);
          readValue(p_Var4,_in,cA.super_VectorDataT<int,_4>.values_ + 1);
          if (((stack0xffffffffffffff98->userOptions_).flags_ & 0x200) != 0) {
            local_34.super_BaseHandle.idx_._1_1_ =
                 (undefined1)c.super_VectorDataT<int,_3>.values_[2];
            local_34.super_BaseHandle.idx_._0_1_ =
                 (undefined1)c.super_VectorDataT<int,_3>.values_[1];
            local_34.super_BaseHandle.idx_._2_1_ =
                 (undefined1)cA.super_VectorDataT<int,_4>.values_[0];
            local_34.super_BaseHandle.idx_._3_1_ =
                 (undefined1)cA.super_VectorDataT<int,_4>.values_[1];
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0xa8))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,&local_34);
          }
        }
      }
      else {
        _nF->flags_ = _nF->flags_ | 0x1000;
        if (((stack0xffffffffffffff98->options_).flags_ & 0x800) == 0) {
          readValue(p_Var4,_in,cAf.super_VectorDataT<float,_4>.field_0.m128 + 2);
          readValue(p_Var4,_in,cAf.super_VectorDataT<float,_4>.field_0.m128 + 3);
          readValue(p_Var4,_in,(float *)&cf);
          if (((stack0xffffffffffffff98->userOptions_).flags_ & 0x200) != 0) {
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0xb0))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,
                       (undefined1 *)((long)&cAf.super_VectorDataT<float,_4>.field_0 + 8));
          }
        }
        else {
          readValue(p_Var4,_in,&local_88);
          readValue(p_Var4,_in,&local_84);
          readValue(p_Var4,_in,(float *)&cAf);
          readValue(p_Var4,_in,cAf.super_VectorDataT<float,_4>.field_0.m128 + 1);
          if (((stack0xffffffffffffff98->userOptions_).flags_ & 0x200) != 0) {
            p_Var4 = (_OFFReader_ *)cA.super_VectorDataT<int,_4>.values_._8_8_;
            (**(code **)(*(long *)cA.super_VectorDataT<int,_4>.values_._8_8_ + 0xb8))
                      (cA.super_VectorDataT<int,_4>.values_._8_8_,uVar3,&local_88);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~_Vector_base
            ((_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)&t);
  return true;
}

Assistant:

bool
_OFFReader_::read_binary(std::istream& _in, BaseImporter& _bi, Options& _opt, bool /*_swap*/) const
{
  unsigned int            i, j, k, l, idx;
  unsigned int            nV, nF, dummy;
  OpenMesh::Vec3f         v, n;
  OpenMesh::Vec3i         c;
  OpenMesh::Vec4i         cA;
  OpenMesh::Vec3f         cf;
  OpenMesh::Vec4f         cAf;
  OpenMesh::Vec2f         t;
  BaseImporter::VHandles  vhandles;
  VertexHandle            vh;

  // read header line
  std::string header;
  std::getline(_in,header);

  // + #Vertice, #Faces, #Edges
  readValue(_in, nV);
  readValue(_in, nF);
  readValue(_in, dummy);

  _bi.reserve(nV, 3*nV, nF);

  // read vertices: coord [hcoord] [normal] [color] [texcoord]
  for (i=0; i<nV && !_in.eof(); ++i)
  {
    // Always read Vertex
    readValue(_in, v[0]);
    readValue(_in, v[1]);
    readValue(_in, v[2]);

    vh = _bi.add_vertex(v);

    if ( options_.vertex_has_normal() ) {
      readValue(_in, n[0]);
      readValue(_in, n[1]);
      readValue(_in, n[2]);

      if ( userOptions_.vertex_has_normal() )
        _bi.set_normal(vh, n);
    }

    if ( options_.vertex_has_color() ) {
      if ( userOptions_.color_is_float() ) {
        _opt += Options::ColorFloat;
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cAf[0]);
          readValue(_in, cAf[1]);
          readValue(_in, cAf[2]);
          readValue(_in, cAf[3]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, cAf );
        }else{

          //without alpha
          readValue(_in, cf[0]);
          readValue(_in, cf[1]);
          readValue(_in, cf[2]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, cf );
        }
      } else {
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cA[0]);
          readValue(_in, cA[1]);
          readValue(_in, cA[2]);
          readValue(_in, cA[3]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, Vec4uc( cA ) );
        }else{
          //without alpha
          readValue(_in, c[0]);
          readValue(_in, c[1]);
          readValue(_in, c[2]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, Vec3uc( c ) );
        }
      }
    }

    if ( options_.vertex_has_texcoord()) {
      readValue(_in, t[0]);
      readValue(_in, t[1]);

      if ( userOptions_.vertex_has_texcoord() )
        _bi.set_texcoord(vh, t);
    }
  }

  // faces
  // #N <v1> <v2> .. <v(n-1)> [color spec]
  // So far color spec is unsupported!
  for (i=0; i<nF; ++i)
  {
    readValue(_in, nV);

    if (nV == 3)
    {
      vhandles.resize(3);
      readValue(_in, j);
      readValue(_in, k);
      readValue(_in, l);

      vhandles[0] = VertexHandle(j);
      vhandles[1] = VertexHandle(k);
      vhandles[2] = VertexHandle(l);
    } else {
      vhandles.clear();
      for (j=0; j<nV; ++j)
      {
         readValue(_in, idx);
         vhandles.push_back(VertexHandle(idx));
      }
    }

    FaceHandle fh = _bi.add_face(vhandles);

    //face color
    if ( _opt.face_has_color() ) {
      if ( userOptions_.color_is_float() ) {
        _opt += Options::ColorFloat;
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cAf[0]);
          readValue(_in, cAf[1]);
          readValue(_in, cAf[2]);
          readValue(_in, cAf[3]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh , cAf );
        }else{
          //without alpha
          readValue(_in, cf[0]);
          readValue(_in, cf[1]);
          readValue(_in, cf[2]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh, cf );
        }
      } else {
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cA[0]);
          readValue(_in, cA[1]);
          readValue(_in, cA[2]);
          readValue(_in, cA[3]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh , Vec4uc( cA ) );
        }else{
          //without alpha
          readValue(_in, c[0]);
          readValue(_in, c[1]);
          readValue(_in, c[2]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh, Vec3uc( c ) );
        }
      }
    }

  }

  // File was successfully parsed.
  return true;

}